

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  CppType CVar1;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff38;
  LogLevel level;
  LogMessage local_98 [2];
  int local_4;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  CVar1 = anon_unknown_18::cpp_type('\0');
  switch((LogMessage *)(ulong)(CVar1 - CPPTYPE_INT32)) {
  case (LogMessage *)0x0:
    local_4 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
    break;
  case (LogMessage *)0x1:
    local_4 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI);
    break;
  case (LogMessage *)0x2:
    local_4 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)*in_RDI);
    break;
  case (LogMessage *)0x3:
    local_4 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)*in_RDI);
    break;
  case (LogMessage *)0x4:
    local_4 = RepeatedField<double>::size((RepeatedField<double> *)*in_RDI);
    break;
  case (LogMessage *)0x5:
    local_4 = RepeatedField<float>::size((RepeatedField<float> *)*in_RDI);
    break;
  case (LogMessage *)0x6:
    local_4 = RepeatedField<bool>::size((RepeatedField<bool> *)*in_RDI);
    break;
  case (LogMessage *)0x7:
    local_4 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
    break;
  case (LogMessage *)0x8:
    local_4 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x49db3a);
    break;
  case (LogMessage *)0x9:
    local_4 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((RepeatedPtrField<google::protobuf::MessageLite> *)0x49db53);
    break;
  default:
    this_00 = local_98;
    LogMessage::LogMessage
              ((LogMessage *)(ulong)(CVar1 - CPPTYPE_INT32),level,(char *)this_00,
               in_stack_ffffffffffffff2c);
    LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    LogMessage::~LogMessage((LogMessage *)0x49dbaf);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  GOOGLE_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return 0;
}